

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::ReadReferenceEntry
          (BamToolsIndex *this,BtiReferenceEntry *refEntry)

{
  int iVar1;
  size_type sVar2;
  undefined8 uVar3;
  int *in_RSI;
  long in_RDI;
  BtiReferenceSummary *refSummary;
  size_type in_stack_ffffffffffffff58;
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  *in_stack_ffffffffffffff60;
  allocator *paVar4;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar5;
  allocator in_stack_ffffffffffffff97;
  string *in_stack_ffffffffffffff98;
  BamToolsIndex *in_stack_ffffffffffffffa0;
  allocator local_31;
  string local_30 [48];
  
  if (-1 < *in_RSI) {
    iVar1 = *in_RSI;
    sVar2 = std::
            vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
            ::size((vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                    *)(in_RDI + 0x38));
    if (iVar1 < (int)sVar2) {
      std::
      vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
      ::at(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      ReadBlocks(in_stack_ffffffffffffffa0,(BtiReferenceSummary *)in_stack_ffffffffffffff98,
                 (BtiBlockVector *)
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
      return;
    }
  }
  uVar5 = 1;
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"BamToolsIndex::ReadReferenceEntry",&local_31);
  paVar4 = (allocator *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff98,"invalid reference requested",paVar4);
  BamException::BamException
            ((BamException *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (string *)CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar5,in_stack_ffffffffffffff90))
            );
  __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::ReadReferenceEntry(BtiReferenceEntry& refEntry) {

    // return false if refId not valid index in file summary structure
    if ( refEntry.ID < 0 || refEntry.ID >= (int)m_indexFileSummary.size() )
        throw BamException("BamToolsIndex::ReadReferenceEntry", "invalid reference requested");

    // use index summary to assist reading the reference's BTI blocks
    const BtiReferenceSummary& refSummary = m_indexFileSummary.at(refEntry.ID);
    ReadBlocks(refSummary, refEntry.Blocks);
}